

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_mul(m2v *A,m2v *B,m2v *AB_out)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  if (0 < AB_out->n_row) {
    iVar3 = 0;
    do {
      if (0 < AB_out->n_col) {
        uVar1 = 0;
        do {
          if ((long)A->n_col < 1) {
            bVar9 = true;
          }
          else {
            puVar2 = (uint *)((uVar1 >> 3 & 0xfffffffffffffffc) + (long)B->e);
            uVar5 = 0;
            uVar6 = 0;
            do {
              uVar7 = uVar6;
              uVar8 = *puVar2 >> ((byte)uVar1 & 0x1f) &
                      A->e[(int)(((uint)(uVar5 >> 5) & 0x7ffffff) + A->row_stride * iVar3)] >>
                      ((byte)uVar5 & 0x1f) & 1;
              uVar5 = uVar5 + 1;
              puVar2 = puVar2 + B->row_stride;
              uVar6 = uVar8 ^ uVar7;
            } while ((long)A->n_col != uVar5);
            bVar9 = uVar8 == uVar7;
          }
          iVar4 = ((uint)(uVar1 >> 5) & 0x7ffffff) + AB_out->row_stride * iVar3;
          uVar6 = 1 << ((byte)uVar1 & 0x1f);
          if (bVar9) {
            AB_out->e[iVar4] = AB_out->e[iVar4] & ~uVar6;
          }
          else {
            AB_out->e[iVar4] = AB_out->e[iVar4] | uVar6;
          }
          uVar1 = uVar1 + 1;
        } while ((int)uVar1 < AB_out->n_col);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < AB_out->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}